

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

void __thiscall
vkb::detail::VulkanFunctions::init_instance_funcs(VulkanFunctions *this,VkInstance inst)

{
  VkInstance inst_local;
  VulkanFunctions *this_local;
  
  this->instance = inst;
  get_inst_proc_addr<void(*)(VkInstance_T*,VkAllocationCallbacks_const*)>
            (this,(_func_void_VkInstance_T_ptr_VkAllocationCallbacks_ptr **)
                  &this->fp_vkDestroyInstance,"vkDestroyInstance");
  get_inst_proc_addr<VkResult(*)(VkInstance_T*,VkDebugUtilsMessengerCreateInfoEXT_const*,VkAllocationCallbacks_const*,VkDebugUtilsMessengerEXT_T**)>
            (this,(_func_VkResult_VkInstance_T_ptr_VkDebugUtilsMessengerCreateInfoEXT_ptr_VkAllocationCallbacks_ptr_VkDebugUtilsMessengerEXT_T_ptr_ptr
                   **)&this->fp_vkCreateDebugUtilsMessengerEXT,"vkCreateDebugUtilsMessengerEXT");
  get_inst_proc_addr<void(*)(VkInstance_T*,VkDebugUtilsMessengerEXT_T*,VkAllocationCallbacks_const*)>
            (this,(_func_void_VkInstance_T_ptr_VkDebugUtilsMessengerEXT_T_ptr_VkAllocationCallbacks_ptr
                   **)&this->fp_vkDestroyDebugUtilsMessengerEXT,"vkDestroyDebugUtilsMessengerEXT");
  get_inst_proc_addr<VkResult(*)(VkInstance_T*,unsigned_int*,VkPhysicalDevice_T**)>
            (this,(_func_VkResult_VkInstance_T_ptr_uint_ptr_VkPhysicalDevice_T_ptr_ptr **)
                  &this->fp_vkEnumeratePhysicalDevices,"vkEnumeratePhysicalDevices");
  get_inst_proc_addr<void(*)(VkPhysicalDevice_T*,VkPhysicalDeviceFeatures*)>
            (this,(_func_void_VkPhysicalDevice_T_ptr_VkPhysicalDeviceFeatures_ptr **)
                  &this->fp_vkGetPhysicalDeviceFeatures,"vkGetPhysicalDeviceFeatures");
  get_inst_proc_addr<void(*)(VkPhysicalDevice_T*,VkPhysicalDeviceFeatures2*)>
            (this,(_func_void_VkPhysicalDevice_T_ptr_VkPhysicalDeviceFeatures2_ptr **)
                  &this->fp_vkGetPhysicalDeviceFeatures2,"vkGetPhysicalDeviceFeatures2");
  get_inst_proc_addr<void(*)(VkPhysicalDevice_T*,VkPhysicalDeviceFeatures2*)>
            (this,(_func_void_VkPhysicalDevice_T_ptr_VkPhysicalDeviceFeatures2_ptr **)
                  &this->fp_vkGetPhysicalDeviceFeatures2KHR,"vkGetPhysicalDeviceFeatures2KHR");
  get_inst_proc_addr<void(*)(VkPhysicalDevice_T*,VkPhysicalDeviceProperties*)>
            (this,(_func_void_VkPhysicalDevice_T_ptr_VkPhysicalDeviceProperties_ptr **)
                  &this->fp_vkGetPhysicalDeviceProperties,"vkGetPhysicalDeviceProperties");
  get_inst_proc_addr<void(*)(VkPhysicalDevice_T*,unsigned_int*,VkQueueFamilyProperties*)>
            (this,(_func_void_VkPhysicalDevice_T_ptr_uint_ptr_VkQueueFamilyProperties_ptr **)
                  &this->fp_vkGetPhysicalDeviceQueueFamilyProperties,
             "vkGetPhysicalDeviceQueueFamilyProperties");
  get_inst_proc_addr<void(*)(VkPhysicalDevice_T*,VkPhysicalDeviceMemoryProperties*)>
            (this,(_func_void_VkPhysicalDevice_T_ptr_VkPhysicalDeviceMemoryProperties_ptr **)
                  &this->fp_vkGetPhysicalDeviceMemoryProperties,
             "vkGetPhysicalDeviceMemoryProperties");
  get_inst_proc_addr<VkResult(*)(VkPhysicalDevice_T*,char_const*,unsigned_int*,VkExtensionProperties*)>
            (this,(_func_VkResult_VkPhysicalDevice_T_ptr_char_ptr_uint_ptr_VkExtensionProperties_ptr
                   **)&this->fp_vkEnumerateDeviceExtensionProperties,
             "vkEnumerateDeviceExtensionProperties");
  get_inst_proc_addr<VkResult(*)(VkPhysicalDevice_T*,VkDeviceCreateInfo_const*,VkAllocationCallbacks_const*,VkDevice_T**)>
            (this,(_func_VkResult_VkPhysicalDevice_T_ptr_VkDeviceCreateInfo_ptr_VkAllocationCallbacks_ptr_VkDevice_T_ptr_ptr
                   **)&this->fp_vkCreateDevice,"vkCreateDevice");
  get_inst_proc_addr<void(*(*)(VkDevice_T*,char_const*))()>
            (this,(_func__func_void_ptr_VkDevice_T_ptr_char_ptr **)&this->fp_vkGetDeviceProcAddr,
             "vkGetDeviceProcAddr");
  get_inst_proc_addr<void(*)(VkInstance_T*,VkSurfaceKHR_T*,VkAllocationCallbacks_const*)>
            (this,(_func_void_VkInstance_T_ptr_VkSurfaceKHR_T_ptr_VkAllocationCallbacks_ptr **)
                  &this->fp_vkDestroySurfaceKHR,"vkDestroySurfaceKHR");
  get_inst_proc_addr<VkResult(*)(VkPhysicalDevice_T*,unsigned_int,VkSurfaceKHR_T*,unsigned_int*)>
            (this,(_func_VkResult_VkPhysicalDevice_T_ptr_uint_VkSurfaceKHR_T_ptr_uint_ptr **)
                  &this->fp_vkGetPhysicalDeviceSurfaceSupportKHR,
             "vkGetPhysicalDeviceSurfaceSupportKHR");
  get_inst_proc_addr<VkResult(*)(VkPhysicalDevice_T*,VkSurfaceKHR_T*,unsigned_int*,VkSurfaceFormatKHR*)>
            (this,(_func_VkResult_VkPhysicalDevice_T_ptr_VkSurfaceKHR_T_ptr_uint_ptr_VkSurfaceFormatKHR_ptr
                   **)&this->fp_vkGetPhysicalDeviceSurfaceFormatsKHR,
             "vkGetPhysicalDeviceSurfaceFormatsKHR");
  get_inst_proc_addr<VkResult(*)(VkPhysicalDevice_T*,VkSurfaceKHR_T*,unsigned_int*,VkPresentModeKHR*)>
            (this,(_func_VkResult_VkPhysicalDevice_T_ptr_VkSurfaceKHR_T_ptr_uint_ptr_VkPresentModeKHR_ptr
                   **)&this->fp_vkGetPhysicalDeviceSurfacePresentModesKHR,
             "vkGetPhysicalDeviceSurfacePresentModesKHR");
  get_inst_proc_addr<VkResult(*)(VkPhysicalDevice_T*,VkSurfaceKHR_T*,VkSurfaceCapabilitiesKHR*)>
            (this,(_func_VkResult_VkPhysicalDevice_T_ptr_VkSurfaceKHR_T_ptr_VkSurfaceCapabilitiesKHR_ptr
                   **)&this->fp_vkGetPhysicalDeviceSurfaceCapabilitiesKHR,
             "vkGetPhysicalDeviceSurfaceCapabilitiesKHR");
  return;
}

Assistant:

void init_instance_funcs(VkInstance inst) {
        instance = inst;
        get_inst_proc_addr(fp_vkDestroyInstance, "vkDestroyInstance");
        get_inst_proc_addr(fp_vkCreateDebugUtilsMessengerEXT, "vkCreateDebugUtilsMessengerEXT");
        get_inst_proc_addr(fp_vkDestroyDebugUtilsMessengerEXT, "vkDestroyDebugUtilsMessengerEXT");
        get_inst_proc_addr(fp_vkEnumeratePhysicalDevices, "vkEnumeratePhysicalDevices");

        get_inst_proc_addr(fp_vkGetPhysicalDeviceFeatures, "vkGetPhysicalDeviceFeatures");
        get_inst_proc_addr(fp_vkGetPhysicalDeviceFeatures2, "vkGetPhysicalDeviceFeatures2");
        get_inst_proc_addr(fp_vkGetPhysicalDeviceFeatures2KHR, "vkGetPhysicalDeviceFeatures2KHR");
        get_inst_proc_addr(fp_vkGetPhysicalDeviceProperties, "vkGetPhysicalDeviceProperties");
        get_inst_proc_addr(fp_vkGetPhysicalDeviceQueueFamilyProperties, "vkGetPhysicalDeviceQueueFamilyProperties");
        get_inst_proc_addr(fp_vkGetPhysicalDeviceMemoryProperties, "vkGetPhysicalDeviceMemoryProperties");
        get_inst_proc_addr(fp_vkEnumerateDeviceExtensionProperties, "vkEnumerateDeviceExtensionProperties");

        get_inst_proc_addr(fp_vkCreateDevice, "vkCreateDevice");
        get_inst_proc_addr(fp_vkGetDeviceProcAddr, "vkGetDeviceProcAddr");

        get_inst_proc_addr(fp_vkDestroySurfaceKHR, "vkDestroySurfaceKHR");
        get_inst_proc_addr(fp_vkGetPhysicalDeviceSurfaceSupportKHR, "vkGetPhysicalDeviceSurfaceSupportKHR");
        get_inst_proc_addr(fp_vkGetPhysicalDeviceSurfaceFormatsKHR, "vkGetPhysicalDeviceSurfaceFormatsKHR");
        get_inst_proc_addr(fp_vkGetPhysicalDeviceSurfacePresentModesKHR, "vkGetPhysicalDeviceSurfacePresentModesKHR");
        get_inst_proc_addr(fp_vkGetPhysicalDeviceSurfaceCapabilitiesKHR, "vkGetPhysicalDeviceSurfaceCapabilitiesKHR");
    }